

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NeuralNetworkClassifier::NeuralNetworkClassifier
          (NeuralNetworkClassifier *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NeuralNetworkClassifier_00411ff8
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->layers_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->layers_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->layers_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->layers_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->preprocessing_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->preprocessing_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->preprocessing_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (NeuralNetworkClassifier *)&_NeuralNetworkClassifier_default_instance_) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  (this->labelprobabilitylayername_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->updateparams_ = (NetworkUpdateParameters *)0x0;
  this->arrayinputshapemapping_ = 0;
  this->imageinputshapemapping_ = 0;
  this->_cached_size_ = 0;
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

NeuralNetworkClassifier::NeuralNetworkClassifier()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.NeuralNetworkClassifier)
}